

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::ValidateEntryPoints(ValidationState_t *_)

{
  ValidationState_t *pVVar1;
  bool bVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  spv_const_context psVar4;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar5;
  Instruction *pIVar6;
  DiagnosticStream *pDVar7;
  spv_result_t error_1;
  spv_result_t error;
  DiagnosticStream local_5d0;
  _Self local_3f8;
  _Self local_3f0;
  DiagnosticStream local_3e8;
  uint32_t *local_210;
  uint *entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  ValidationState_t *local_18;
  ValidationState_t *__local;
  
  local_18 = _;
  ValidationState_t::ComputeFunctionToEntryPointMapping(_);
  ValidationState_t::ComputeRecursiveEntryPoints(local_18);
  pvVar3 = ValidationState_t::entry_points(local_18);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar3);
  if ((!bVar2) || (bVar2 = ValidationState_t::HasCapability(local_18,CapabilityLinkage), bVar2)) {
    pvVar3 = ValidationState_t::entry_points(local_18);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
    entry_point = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&entry_point), bVar2) {
      local_210 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end2);
      bVar2 = ValidationState_t::IsFunctionCallTarget(local_18,*local_210);
      pVVar1 = local_18;
      if (bVar2) {
        pIVar6 = ValidationState_t::FindDef(local_18,*local_210);
        ValidationState_t::diag(&local_3e8,pVVar1,SPV_ERROR_INVALID_BINARY,pIVar6);
        pDVar7 = DiagnosticStream::operator<<(&local_3e8,(char (*) [13])"A function (");
        pDVar7 = DiagnosticStream::operator<<(pDVar7,local_210);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [93])
                                   ") may not be targeted by both an OpEntryPoint instruction and an OpFunctionCall instruction."
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        DiagnosticStream::~DiagnosticStream(&local_3e8);
        return __local._4_4_;
      }
      psVar4 = ValidationState_t::context(local_18);
      bVar2 = spvIsVulkanEnv(psVar4->target_env);
      if (bVar2) {
        psVar5 = ValidationState_t::recursive_entry_points(local_18);
        local_3f0._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       (psVar5,local_210);
        psVar5 = ValidationState_t::recursive_entry_points(local_18);
        local_3f8._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       (psVar5);
        bVar2 = std::operator!=(&local_3f0,&local_3f8);
        pVVar1 = local_18;
        if (bVar2) {
          pIVar6 = ValidationState_t::FindDef(local_18,*local_210);
          ValidationState_t::diag(&local_5d0,pVVar1,SPV_ERROR_INVALID_BINARY,pIVar6);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&error_1,local_18,0x121a,(char *)0x0);
          pDVar7 = DiagnosticStream::operator<<
                             (&local_5d0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &error_1);
          pDVar7 = DiagnosticStream::operator<<
                             (pDVar7,(char (*) [52])
                                     "Entry points may not have a call graph with cycles.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
          std::__cxx11::string::~string((string *)&error_1);
          DiagnosticStream::~DiagnosticStream(&local_5d0);
          return __local._4_4_;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    __local._4_4_ = ValidateFloatControls2(local_18);
    if ((__local._4_4_ == SPV_SUCCESS) &&
       (__local._4_4_ = ValidateDuplicateExecutionModes(local_18), __local._4_4_ == SPV_SUCCESS)) {
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)&__range2,local_18,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
    pDVar7 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&__range2,
                        (char (*) [101])
                        "No OpEntryPoint instruction was found. This is only allowed if the Linkage capability is being used."
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&__range2);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateEntryPoints(ValidationState_t& _) {
  _.ComputeFunctionToEntryPointMapping();
  _.ComputeRecursiveEntryPoints();

  if (_.entry_points().empty() && !_.HasCapability(spv::Capability::Linkage)) {
    return _.diag(SPV_ERROR_INVALID_BINARY, nullptr)
           << "No OpEntryPoint instruction was found. This is only allowed if "
              "the Linkage capability is being used.";
  }

  for (const auto& entry_point : _.entry_points()) {
    if (_.IsFunctionCallTarget(entry_point)) {
      return _.diag(SPV_ERROR_INVALID_BINARY, _.FindDef(entry_point))
             << "A function (" << entry_point
             << ") may not be targeted by both an OpEntryPoint instruction and "
                "an OpFunctionCall instruction.";
    }

    // For Vulkan, the static function-call graph for an entry point
    // must not contain cycles.
    if (spvIsVulkanEnv(_.context()->target_env)) {
      if (_.recursive_entry_points().find(entry_point) !=
          _.recursive_entry_points().end()) {
        return _.diag(SPV_ERROR_INVALID_BINARY, _.FindDef(entry_point))
               << _.VkErrorID(4634)
               << "Entry points may not have a call graph with cycles.";
      }
    }
  }

  if (auto error = ValidateFloatControls2(_)) {
    return error;
  }
  if (auto error = ValidateDuplicateExecutionModes(_)) {
    return error;
  }

  return SPV_SUCCESS;
}